

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_event_thread.c
# Opt level: O1

void ares_event_thread_process_fd
               (ares_event_thread_t *e,ares_socket_t fd,void *data,ares_event_flags_t flags)

{
  ares_fd_events_t local_8;
  
  local_8 = (ares_fd_events_t)(CONCAT44(flags,fd) & 0x3ffffffff);
  ares_process_fds(e->channel,&local_8,1,1);
  return;
}

Assistant:

static void ares_event_thread_process_fd(ares_event_thread_t *e,
                                         ares_socket_t fd, void *data,
                                         ares_event_flags_t flags)
{
  ares_fd_events_t event;
  (void)data;

  event.fd     = fd;
  event.events = 0;
  if (flags & ARES_EVENT_FLAG_READ) {
    event.events |= ARES_FD_EVENT_READ;
  }
  if (flags & ARES_EVENT_FLAG_WRITE) {
    event.events |= ARES_FD_EVENT_WRITE;
  }
  ares_process_fds(e->channel, &event, 1, ARES_PROCESS_FLAG_SKIP_NON_FD);
}